

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTaskManager.hpp
# Opt level: O2

void __thiscall sftm::CTaskManager::Stop(CTaskManager *this)

{
  uint uVar1;
  uint32_t nWorker;
  uint uVar2;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  
  uVar1 = this->m_nWorkerCount;
  for (uVar2 = 1; uVar2 <= uVar1; uVar2 = uVar2 + 1) {
    (this->m_workers)._M_elems[uVar2].m_bStopping = true;
  }
  for (uVar2 = 1; uVar2 <= uVar1; uVar2 = uVar2 + 1) {
    while ((this->m_workers)._M_elems[uVar2].m_bFinished == false) {
      local_30.__r = 10;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_30);
      std::condition_variable::notify_all();
    }
    uVar1 = this->m_nWorkerCount;
  }
  return;
}

Assistant:

void Stop() noexcept
		{
			for (std::uint32_t nWorker = 1; nWorker <= m_nWorkerCount; nWorker++)
				m_workers[nWorker].Stop();

			for (std::uint32_t nWorker = 1; nWorker <= m_nWorkerCount; nWorker++)
			{
				while (!m_workers[nWorker].IsFinished())
				{
					std::this_thread::sleep_for(std::chrono::milliseconds(10));
					m_cvWorkerIdle.notify_all();
				}
			}
		}